

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O0

void http_dial_cb(void *arg)

{
  nng_http *local_38;
  nni_http_conn *conn;
  nng_stream *stream;
  nni_aio *pnStack_20;
  nng_err rv;
  nni_aio *aio;
  nni_http_client *c;
  void *arg_local;
  
  aio = (nni_aio *)arg;
  c = (nni_http_client *)arg;
  nni_mtx_lock((nni_mtx *)((long)arg + 0x18));
  stream._4_4_ = nni_aio_result((nni_aio *)&(aio->a_task).task_busy);
  pnStack_20 = (nni_aio *)nni_list_first((nni_list *)aio);
  if (pnStack_20 == (nni_aio *)0x0) {
    nni_mtx_unlock((nni_mtx *)&aio->a_stop);
    if (stream._4_4_ == NNG_OK) {
      conn = (nni_http_conn *)nni_aio_get_output((nni_aio *)&(aio->a_task).task_busy,0);
      nng_stream_free((nng_stream *)conn);
    }
  }
  else if (stream._4_4_ == NNG_OK) {
    nni_aio_list_remove(pnStack_20);
    conn = (nni_http_conn *)nni_aio_get_output((nni_aio *)&(aio->a_task).task_busy,0);
    if (conn == (nni_http_conn *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_client.c"
                ,0x4a,"stream != NULL");
    }
    stream._4_4_ = nni_http_init(&local_38,(nng_stream *)conn,true);
    http_dial_start((nni_http_client *)aio);
    nni_mtx_unlock((nni_mtx *)&aio->a_stop);
    if (stream._4_4_ == NNG_OK) {
      nni_http_set_host(local_38,(char *)&aio[1].a_task.task_busy);
      nni_aio_set_output(pnStack_20,0,local_38);
      nni_aio_finish(pnStack_20,NNG_OK,0);
    }
    else {
      nni_aio_finish_error(pnStack_20,stream._4_4_);
    }
  }
  else {
    nni_aio_list_remove(pnStack_20);
    http_dial_start((nni_http_client *)aio);
    nni_mtx_unlock((nni_mtx *)&aio->a_stop);
    nni_aio_finish_error(pnStack_20,stream._4_4_);
  }
  return;
}

Assistant:

static void
http_dial_cb(void *arg)
{
	nni_http_client *c = arg;
	nni_aio         *aio;
	nng_err          rv;
	nng_stream      *stream;
	nni_http_conn   *conn;

	nni_mtx_lock(&c->mtx);
	rv = nni_aio_result(&c->aio);

	if ((aio = nni_list_first(&c->aios)) == NULL) {
		// User abandoned request, and no residuals left.
		nni_mtx_unlock(&c->mtx);
		if (rv == 0) {
			stream = nni_aio_get_output(&c->aio, 0);
			nng_stream_free(stream);
		}
		return;
	}

	if (rv != NNG_OK) {
		nni_aio_list_remove(aio);
		http_dial_start(c);
		nni_mtx_unlock(&c->mtx);
		nni_aio_finish_error(aio, rv);
		return;
	}

	nni_aio_list_remove(aio);
	stream = nni_aio_get_output(&c->aio, 0);
	NNI_ASSERT(stream != NULL);

	rv = nni_http_init(&conn, stream, true);

	// set up the host header
	http_dial_start(c);
	nni_mtx_unlock(&c->mtx);

	if (rv != NNG_OK) {
		// the conn_init function will have already discard stream.
		nni_aio_finish_error(aio, rv);
		return;
	}
	nni_http_set_host(conn, c->host);
	nni_aio_set_output(aio, 0, conn);
	nni_aio_finish(aio, NNG_OK, 0);
}